

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrency.h
# Opt level: O0

void skiwi::
     parallel_for<unsigned_long,skiwi::cps_conversion(skiwi::Program&,skiwi::compiler_options_const&)::__0>
               (unsigned_long first,unsigned_long last,anon_class_8_1_ba1d37e4 fun,
               compiler_options *ops)

{
  bool bVar1;
  uint uVar2;
  compiler_options *local_d0;
  unsigned_long i;
  thread *t;
  iterator __end3;
  iterator __begin3;
  vector<std::thread,_std::allocator<std::thread>_> *__range3;
  thread local_98;
  unsigned_long local_90;
  unsigned_long j;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  type inner_loop;
  unsigned_long n_lacking_tasks;
  unsigned_long n_max_tasks_per_thread;
  unsigned_long n;
  unsigned_long n_threads;
  compiler_options *ops_local;
  unsigned_long last_local;
  unsigned_long first_local;
  anon_class_8_1_ba1d37e4 fun_local;
  
  local_d0 = (compiler_options *)first;
  n_threads = (unsigned_long)ops;
  ops_local = (compiler_options *)last;
  last_local = first;
  first_local = (unsigned_long)fun.beg;
  if ((ops->parallel & 1U) == 0) {
    for (; local_d0 != ops_local; local_d0 = (compiler_options *)&local_d0->do_alpha_conversion) {
      cps_conversion::anon_class_8_1_ba1d37e4::operator()
                ((anon_class_8_1_ba1d37e4 *)&first_local,(size_t)local_d0);
    }
  }
  else {
    uVar2 = std::thread::hardware_concurrency();
    n = (unsigned_long)uVar2;
    n_max_tasks_per_thread = (long)ops_local - last_local;
    n_lacking_tasks =
         n_max_tasks_per_thread / n + (long)(int)(uint)(n_max_tasks_per_thread % n != 0);
    inner_loop.first = (unsigned_long *)(n_lacking_tasks * n - n_max_tasks_per_thread);
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)&n;
    inner_loop.n_threads = (unsigned_long *)&inner_loop.first;
    inner_loop.n_lacking_tasks = &n_lacking_tasks;
    inner_loop.n_max_tasks_per_thread = &first_local;
    inner_loop.fun = (anon_class_8_1_ba1d37e4 *)&last_local;
    std::vector<std::thread,_std::allocator<std::thread>_>::vector
              ((vector<std::thread,_std::allocator<std::thread>_> *)&j);
    for (local_90 = 0; local_90 < n; local_90 = local_90 + 1) {
      std::thread::
      thread<skiwi::parallel_for<unsigned_long,skiwi::cps_conversion(skiwi::Program&,skiwi::compiler_options_const&)::__0>(unsigned_long,unsigned_long,skiwi::cps_conversion(skiwi::Program&,skiwi::compiler_options_const&)::__0,skiwi::compiler_options_const&)::_lambda(unsigned_long)_1_&,unsigned_long&,void>
                (&local_98,
                 (type *)&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,&local_90);
      std::vector<std::thread,_std::allocator<std::thread>_>::push_back
                ((vector<std::thread,_std::allocator<std::thread>_> *)&j,&local_98);
      std::thread::~thread(&local_98);
    }
    __end3 = std::vector<std::thread,_std::allocator<std::thread>_>::begin
                       ((vector<std::thread,_std::allocator<std::thread>_> *)&j);
    t = (thread *)
        std::vector<std::thread,_std::allocator<std::thread>_>::end
                  ((vector<std::thread,_std::allocator<std::thread>_> *)&j);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                       *)&t), bVar1) {
      __gnu_cxx::
      __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
      operator*(&__end3);
      std::thread::join();
      __gnu_cxx::
      __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
      operator++(&__end3);
    }
    std::vector<std::thread,_std::allocator<std::thread>_>::~vector
              ((vector<std::thread,_std::allocator<std::thread>_> *)&j);
  }
  return;
}

Assistant:

void parallel_for(_Type first, _Type last, TFunctor fun, const compiler_options& ops)
  {
  if (ops.parallel)
    {
    const _Type n_threads = (_Type)std::thread::hardware_concurrency();

    const _Type n = last - first;

    const _Type n_max_tasks_per_thread = (n / n_threads) + (n % n_threads == 0 ? 0 : 1);
    const _Type n_lacking_tasks = n_max_tasks_per_thread * n_threads - n;

    auto inner_loop = [&](const _Type thread_index)
      {
      const _Type n_lacking_tasks_so_far = n_threads > (thread_index + n_lacking_tasks) ? 0 : (thread_index + n_lacking_tasks) - n_threads;
      const _Type inclusive_start_index = thread_index * n_max_tasks_per_thread - n_lacking_tasks_so_far;
      const _Type exclusive_end_index = inclusive_start_index + n_max_tasks_per_thread - (thread_index + n_lacking_tasks >= n_threads ? 1 : 0);

      for (_Type k = inclusive_start_index; k < exclusive_end_index; ++k)
        {
        fun(k + first);
        }
      };
    std::vector<std::thread> threads;
    for (_Type j = 0; j < n_threads; ++j) { threads.push_back(std::thread(inner_loop, j)); }
    for (auto& t : threads) { t.join(); }

    }
  else
    {
    for (_Type i = first; i != last; ++i)
      fun(i);
    }
  }